

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::StrPair::SetStr(StrPair *this,char *str,int flags)

{
  size_t sVar1;
  char *pcVar2;
  size_t len;
  int flags_local;
  char *str_local;
  StrPair *this_local;
  
  Reset(this);
  sVar1 = strlen(str);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  this->_start = pcVar2;
  memcpy(this->_start,str,sVar1 + 1);
  this->_end = this->_start + sVar1;
  this->_flags = flags | 0x200;
  return;
}

Assistant:

void StrPair::SetStr( const char* str, int flags )
{
    Reset();
    size_t len = strlen( str );
    _start = new char[ len+1 ];
    memcpy( _start, str, len+1 );
    _end = _start + len;
    _flags = flags | NEEDS_DELETE;
}